

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

uint Gli_ManSimulateSeqNode(Gli_Man_t *p,Gli_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Gli_Obj_t *local_58;
  Gli_Obj_t *pFanin;
  int local_48;
  int Phase;
  int k;
  int i;
  int nFanins;
  uint Result;
  uint pSimInfos [6];
  Gli_Obj_t *pNode_local;
  Gli_Man_t *p_local;
  
  i = 0;
  iVar1 = Gli_ObjFaninNum(pNode);
  if (iVar1 < 0x11) {
    Phase = 0;
    while( true ) {
      bVar3 = false;
      if (Phase < (int)(*(uint *)pNode >> 4 & 7)) {
        local_58 = Gli_ObjFanin(pNode,Phase);
        bVar3 = local_58 != (Gli_Obj_t *)0x0;
      }
      if (!bVar3) break;
      (&nFanins)[Phase] = local_58->uSimInfo;
      Phase = Phase + 1;
    }
    for (Phase = 0; Phase < 0x20; Phase = Phase + 1) {
      pFanin._4_4_ = 0;
      for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
        if (((uint)(&nFanins)[local_48] >> ((byte)Phase & 0x1f) & 1) != 0) {
          pFanin._4_4_ = 1 << ((byte)local_48 & 0x1f) | pFanin._4_4_;
        }
      }
      iVar2 = Abc_InfoHasBit((uint *)pNode->pTruth,pFanin._4_4_);
      if (iVar2 != 0) {
        i = 1 << ((byte)Phase & 0x1f) | i;
      }
    }
    return i;
  }
  __assert_fail("nFanins <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                ,0x24a,"unsigned int Gli_ManSimulateSeqNode(Gli_Man_t *, Gli_Obj_t *)");
}

Assistant:

unsigned Gli_ManSimulateSeqNode( Gli_Man_t * p, Gli_Obj_t * pNode )
{
    unsigned pSimInfos[6], Result = 0;
    int nFanins = Gli_ObjFaninNum(pNode);
    int i, k, Phase;
    Gli_Obj_t * pFanin;
    assert( nFanins <= 16 );
    Gli_ObjForEachFanin( pNode, pFanin, i )
        pSimInfos[i] = pFanin->uSimInfo;
    for ( i = 0; i < 32; i++ )
    {
        Phase = 0;
        for ( k = 0; k < nFanins; k++ )
            if ( (pSimInfos[k] >> i) & 1 )
                Phase |= (1 << k);
        if ( Abc_InfoHasBit( (unsigned *)pNode->pTruth, Phase ) )
            Result |= (1 << i);
    }
    return Result;
}